

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blob.c
# Opt level: O0

blob_t blobCopy(blob_t dest,blob_t src)

{
  void *dest_00;
  blob_t in_RSI;
  blob_t in_RDI;
  size_t size;
  void *in_stack_ffffffffffffffd8;
  undefined8 local_8;
  
  local_8 = in_RDI;
  if (in_RDI != in_RSI) {
    dest_00 = (void *)blobSize(in_RSI);
    local_8 = blobResize(in_RSI,(size_t)dest_00);
    if (local_8 != (blob_t)0x0) {
      memCopy(dest_00,in_stack_ffffffffffffffd8,0x111675);
    }
  }
  return local_8;
}

Assistant:

blob_t blobCopy(blob_t dest, const blob_t src)
{
	size_t size;
	ASSERT(blobIsValid(dest) && blobIsValid(src));
	if (dest == src)
		return dest;
	size = blobSize(src);
	dest = blobResize(dest, size);
	if (dest)
		memCopy(dest, src, size);
	return dest;
}